

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protodec.c
# Opt level: O2

void protodec_generate_nmea(demod_state_t *d,int bufferlen,int fillbits,time_t received_t)

{
  char *pcVar1;
  ulong uVar2;
  unsigned_long uVar3;
  byte bVar4;
  byte bVar5;
  byte *pbVar6;
  ulong uVar7;
  byte bVar8;
  int from;
  
  bVar4 = 1;
  if (0x150 < bufferlen) {
    bVar4 = ((char)((ulong)(uint)bufferlen / 0x150) + '\x01') - ((uint)bufferlen % 0x150 == 0);
  }
  uVar2 = (ulong)((1 < bVar4) + 0xe);
  bVar8 = 0;
  from = 0;
  uVar7 = uVar2;
  do {
    for (; (uVar7 < (1 < bVar4 | 0x46) && (from < bufferlen)); from = from + 6) {
      uVar3 = protodec_henten(from,6,d->rbuffer);
      d->nmea[uVar7] = (char)uVar3 + (0x27 < ((uint)uVar3 & 0xf8)) * '\b' + '0';
      uVar7 = uVar7 + 1;
    }
    bVar8 = bVar8 + 1;
    builtin_strncpy(d->nmea,"!AIVDM,0,0,",0xb);
    d->nmea[7] = d->nmea[7] + bVar4;
    d->nmea[9] = d->nmea[9] + bVar8;
    builtin_strncpy(d->nmea + uVar7,",0*00",6);
    if (bVar4 < 2) {
      d->nmea[0xb] = ',';
      d->nmea[0xc] = d->chanid;
      d->nmea[0xd] = ',';
    }
    else {
      d->nmea[0xb] = d->seqnr + '0';
      d->nmea[0xc] = ',';
      d->nmea[0xd] = d->chanid;
      d->nmea[0xe] = ',';
      if (bVar8 == bVar4) {
        d->nmea[uVar7 + 1] = (char)fillbits + '0';
      }
    }
    pcVar1 = d->nmea;
    bVar5 = pcVar1[1];
    for (pbVar6 = (byte *)(pcVar1 + 2); *pbVar6 != 0x2a; pbVar6 = pbVar6 + 1) {
      bVar5 = bVar5 ^ *pbVar6;
    }
    sprintf(pcVar1 + uVar7 + 3,"%02X\r\n",(ulong)bVar5);
    if (on_nmea_sentence_received != (decoder_on_nmea_sentence_received)0x0) {
      (*on_nmea_sentence_received)(d->nmea,(int)uVar7 + 7,bVar4,bVar8);
    }
    uVar7 = uVar2;
  } while (bVar8 < bVar4);
  return;
}

Assistant:

void protodec_generate_nmea(struct demod_state_t *d, int bufferlen, int fillbits, time_t received_t)
{
	int senlen;
	int pos;
    int k, offset;
	int m;
    unsigned char sentences, sentencenum, nmeachk, letter;
	
	//6bits to nmea-ascii. One sentence len max 82char
	//inc. head + tail.This makes inside datamax 62char multipart, 62 single
    senlen = 56;		//this is normally not needed.For testing only. May be fixed number
    if (bufferlen <= (senlen * 6)) {
		sentences = 1;
	} else {
		sentences = bufferlen / (senlen * 6);
		//sentences , if overflow put one more
		if (bufferlen % (senlen * 6) != 0)
			sentences++;
	};

    sentencenum = 0;
	pos = 0;
    offset = (sentences>1) ? 15 : 14;
	do {
        k = offset;		//leave room for nmea header
        while (k < senlen + offset && bufferlen > pos) {
            letter = (unsigned char)protodec_henten(pos, 6, d->rbuffer);
			// 6bit-to-ascii conversion by IEC
            letter += (letter < 40) ? 48 : 56;
			d->nmea[k] = letter;
			pos += 6;
			k++;
		}
		sentencenum++;
		
        memcpy(&d->nmea[0], "!AIVDM,0,0,", 11);
        d->nmea[7] += sentences;
        d->nmea[9] += sentencenum;

        memcpy(&d->nmea[k], ",0*00\0", 6);
		
		if (sentences > 1) {
            d->nmea[11] = '0' + d->seqnr;
            d->nmea[12] = ',';
            d->nmea[13] = d->chanid;
            d->nmea[14] = ',';
            if (sentencenum == sentences) d->nmea[k + 1] = '0' + fillbits;
        } else {
            d->nmea[11] = ',';
            d->nmea[12] = d->chanid;
            d->nmea[13] = ',';
		}

        m = 1;
        nmeachk = d->nmea[m++];
        while (d->nmea[m] != '*') nmeachk ^= d->nmea[m++];

        sprintf(&d->nmea[k + 3], "%02X\r\n", nmeachk);
        if (on_nmea_sentence_received != NULL)
            on_nmea_sentence_received(d->nmea, k+7, sentences, sentencenum);
    } while (sentencenum < sentences);
}